

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding_validators.h
# Opt level: O2

bool cppcms::encoding::koi8_valid<char_const*>(char *p,char *e,size_t *count)

{
  byte bVar1;
  size_t sVar2;
  
  sVar2 = *count;
  for (; sVar2 = sVar2 + 1, p != e; p = (char *)((byte *)p + 1)) {
    *count = sVar2;
    bVar1 = *p;
    if (((0xd < bVar1) || ((0x2600U >> (bVar1 & 0x1f) & 1) == 0)) &&
       ((bVar1 < 0x20 || (bVar1 == 0x7f)))) break;
  }
  return p == e;
}

Assistant:

bool koi8_valid(Iterator p,Iterator e,size_t &count)
	{
		while(p!=e) {
			count++;
			unsigned c=(unsigned char)*p++;
			if(c==0x09 || c==0xA || c==0xD)
				continue;
			if(c<0x20 || 0x7F==c)
				return false;
		}
		return true;
	}